

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

void __thiscall Process::handleInput(Process *this,int fd)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  size_t sVar4;
  char *pcVar5;
  ssize_t sVar6;
  int *piVar7;
  undefined1 local_e8 [4];
  int err;
  Process *local_d8;
  code *local_d0;
  undefined8 local_c8;
  type local_c0;
  function<void_(int,_unsigned_int)> local_a8;
  shared_ptr<EventLoop> local_88;
  String local_78;
  reference local_58;
  String *front;
  int local_48;
  int want;
  int w;
  shared_ptr<EventLoop> local_38;
  shared_ptr<EventLoop> local_28;
  int local_14;
  Process *pPStack_10;
  int fd_local;
  Process *this_local;
  
  local_14 = fd;
  pPStack_10 = this;
  EventLoop::eventLoop();
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_28);
  if (!bVar1) {
    __assert_fail("EventLoop::eventLoop()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                  ,0x2ec,"void Process::handleInput(int)");
  }
  std::shared_ptr<EventLoop>::~shared_ptr(&local_28);
  EventLoop::eventLoop();
  peVar3 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_38);
  EventLoop::unregisterSocket(peVar3,local_14);
  std::shared_ptr<EventLoop>::~shared_ptr(&local_38);
  while( true ) {
    bVar1 = std::deque<String,_std::allocator<String>_>::empty(&this->mStdInBuffer);
    if (bVar1) {
      return;
    }
    local_58 = std::deque<String,_std::allocator<String>_>::front(&this->mStdInBuffer);
    if (this->mStdInIndex == 0) {
      sVar4 = String::size(local_58);
      front._4_4_ = (int)sVar4;
      do {
        iVar2 = local_14;
        pcVar5 = String::constData(local_58);
        sVar6 = ::write(iVar2,pcVar5,(long)front._4_4_);
        local_48 = (int)sVar6;
        bVar1 = false;
        if (local_48 == -1) {
          piVar7 = __errno_location();
          bVar1 = *piVar7 == 4;
        }
      } while (bVar1);
    }
    else {
      sVar4 = String::size(local_58);
      front._4_4_ = (int)sVar4 - this->mStdInIndex;
      do {
        iVar2 = local_14;
        String::mid(&local_78,local_58,(long)this->mStdInIndex,0xffffffffffffffff);
        pcVar5 = String::constData(&local_78);
        sVar6 = ::write(iVar2,pcVar5,(long)front._4_4_);
        local_48 = (int)sVar6;
        String::~String(&local_78);
        bVar1 = false;
        if (local_48 == -1) {
          piVar7 = __errno_location();
          bVar1 = *piVar7 == 4;
        }
      } while (bVar1);
    }
    if (local_48 == -1) break;
    if (local_48 == front._4_4_) {
      std::deque<String,_std::allocator<String>_>::pop_front(&this->mStdInBuffer);
      bVar1 = std::deque<String,_std::allocator<String>_>::empty(&this->mStdInBuffer);
      if ((bVar1) && ((this->mWantStdInClosed & 1U) != 0)) {
        EventLoop::eventLoop();
        peVar3 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_e8);
        EventLoop::unregisterSocket(peVar3,this->mStdIn[1]);
        std::shared_ptr<EventLoop>::~shared_ptr((shared_ptr<EventLoop> *)local_e8);
        do {
          iVar2 = close(this->mStdIn[1]);
          bVar1 = false;
          if (iVar2 == -1) {
            piVar7 = __errno_location();
            bVar1 = *piVar7 == 4;
          }
        } while (bVar1);
        this->mStdIn[1] = -1;
        this->mWantStdInClosed = false;
      }
      this->mStdInIndex = 0;
    }
    else {
      this->mStdInIndex = local_48 + this->mStdInIndex;
    }
  }
  EventLoop::eventLoop();
  peVar3 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_88);
  iVar2 = local_14;
  local_d0 = processCallback;
  local_c8 = 0;
  local_d8 = this;
  std::
  bind<void(Process::*)(int,int),Process*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_c0,(offset_in_Process_to_subr *)&local_d0,&local_d8,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
  std::function<void(int,unsigned_int)>::
  function<std::_Bind<void(Process::*(Process*,std::_Placeholder<1>,std::_Placeholder<2>))(int,int)>,void>
            ((function<void(int,unsigned_int)> *)&local_a8,&local_c0);
  EventLoop::registerSocket(peVar3,iVar2,2,&local_a8);
  std::function<void_(int,_unsigned_int)>::~function(&local_a8);
  std::shared_ptr<EventLoop>::~shared_ptr(&local_88);
  return;
}

Assistant:

void Process::handleInput(int fd)
{
    assert(EventLoop::eventLoop());
    EventLoop::eventLoop()->unregisterSocket(fd);

    //static int ting = 0;
    //printf("Process::handleInput (cnt=%d)\n", ++ting);
    for (;;) {
        if (mStdInBuffer.empty())
            return;

        //printf("Process::handleInput in loop\n");
        int w, want;
        const String &front = mStdInBuffer.front();
        if (mStdInIndex) {
            want = front.size() - mStdInIndex;
            eintrwrap(w, ::write(fd, front.mid(mStdInIndex).constData(), want));
        } else {
            want = front.size();
            eintrwrap(w, ::write(fd, front.constData(), want));
        }
        if (w == -1) {
            EventLoop::eventLoop()->registerSocket(fd, EventLoop::SocketWrite, std::bind(&Process::processCallback, this, std::placeholders::_1, std::placeholders::_2));
            break;
        } else if (w == want) {
            mStdInBuffer.pop_front();
            if (mStdInBuffer.empty() && mWantStdInClosed) {
                EventLoop::eventLoop()->unregisterSocket(mStdIn[1]);
                int err;
                eintrwrap(err, ::close(mStdIn[1]));
                mStdIn[1] = -1;
                mWantStdInClosed = false;
            }
            mStdInIndex = 0;
        } else
            mStdInIndex += w;
    }
}